

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterFinishAddColumn(Parse *pParse,Token *pColDef)

{
  Vdbe *p;
  int iVar1;
  int iVar2;
  bool bVar3;
  Column *pCStack_88;
  int savedDbFlags;
  char *zEnd;
  sqlite3_value *psStack_78;
  int rc;
  sqlite3_value *pVal;
  Vdbe *pVStack_68;
  int r1;
  Vdbe *v;
  sqlite3 *db;
  Expr *pDflt;
  Column *pCol;
  char *zCol;
  char *zTab;
  char *zDb;
  Table *pTStack_28;
  int iDb;
  Table *pTab;
  Table *pNew;
  Token *pColDef_local;
  Parse *pParse_local;
  
  pVStack_68 = pParse->pVdbe;
  v = (Vdbe *)pParse->db;
  if ((pParse->nErr == 0) && (((sqlite3 *)v)->mallocFailed == '\0')) {
    pTab = pParse->pNewTable;
    pNew = (Table *)pColDef;
    pColDef_local = (Token *)pParse;
    zDb._4_4_ = sqlite3SchemaToIndex((sqlite3 *)v,pTab->pSchema);
    zTab = *(char **)(*(long *)&v->nVar + (long)zDb._4_4_ * 0x20);
    zCol = pTab->zName + 0x10;
    pDflt = (Expr *)(pTab->aCol + (pTab->nCol + -1));
    db = (sqlite3 *)(pDflt->u).zToken;
    pTStack_28 = sqlite3FindTable((sqlite3 *)v,zCol,zTab);
    iVar1 = sqlite3AuthCheck((Parse *)pColDef_local,0x1a,zTab,pTStack_28->zName,(char *)0x0);
    if (iVar1 == 0) {
      if ((db != (sqlite3 *)0x0) && (*(char *)&db->pDfltColl->zName == 'e')) {
        db = (sqlite3 *)0x0;
      }
      if (((ulong)pDflt->pRight & 0x1000000) == 0) {
        if (pTab->pIndex == (Index *)0x0) {
          if ((((v->nCursor & 0x4000U) == 0) || (pTab->pFKey == (FKey *)0x0)) ||
             (db == (sqlite3 *)0x0)) {
            if ((*(char *)&pDflt->pRight == '\0') || (db != (sqlite3 *)0x0)) {
              if (db != (sqlite3 *)0x0) {
                psStack_78 = (sqlite3_value *)0x0;
                iVar1 = sqlite3ValueFromExpr
                                  ((sqlite3 *)v,(Expr *)db,'\x01','A',&stack0xffffffffffffff88);
                if (iVar1 != 0) {
                  return;
                }
                if (psStack_78 == (sqlite3_value *)0x0) {
                  sqlite3ErrorMsg((Parse *)pColDef_local,
                                  "Cannot add a column with non-constant default");
                  return;
                }
                sqlite3ValueFree(psStack_78);
              }
              pCol = (Column *)
                     sqlite3DbStrNDup((sqlite3 *)v,pNew->zName,(ulong)*(uint *)&pNew->aCol);
              if (pCol != (Column *)0x0) {
                iVar1 = v->nCursor;
                pCStack_88 = (Column *)((long)&pCol->zName + (ulong)(*(int *)&pNew->aCol - 1));
                while( true ) {
                  bVar3 = false;
                  if ((pCol < pCStack_88) && (bVar3 = true, *(char *)&pCStack_88->zName != ';')) {
                    bVar3 = (""[*(byte *)&pCStack_88->zName] & 1) != 0;
                  }
                  if (!bVar3) break;
                  *(char *)&pCStack_88->zName = '\0';
                  pCStack_88 = (Column *)&pCStack_88[-1].field_0x1f;
                }
                v->nCursor = v->nCursor | 0x2000000;
                sqlite3NestedParse((Parse *)pColDef_local,
                                   "UPDATE \"%w\".%s SET sql = substr(sql,1,%d) || \', \' || %Q || substr(sql,%d) WHERE type = \'table\' AND name = %Q"
                                   ,zTab,"sqlite_master",(ulong)(uint)pTab->addColOffset,pCol,
                                   pTab->addColOffset + 1,zCol);
                sqlite3DbFree((sqlite3 *)v,pCol);
                v->nCursor = iVar1;
              }
              pVal._4_4_ = sqlite3GetTempReg((Parse *)pColDef_local);
              sqlite3VdbeAddOp3(pVStack_68,0x65,zDb._4_4_,pVal._4_4_,2);
              sqlite3VdbeUsesBtree(pVStack_68,zDb._4_4_);
              sqlite3VdbeAddOp2(pVStack_68,0x45,pVal._4_4_,-2);
              p = pVStack_68;
              iVar1 = pVal._4_4_;
              iVar2 = sqlite3VdbeCurrentAddr(pVStack_68);
              sqlite3VdbeAddOp2(p,0x2e,iVar1,iVar2 + 2);
              sqlite3VdbeAddOp3(pVStack_68,0x66,zDb._4_4_,2,3);
              sqlite3ReleaseTempReg((Parse *)pColDef_local,pVal._4_4_);
              reloadTableSchema((Parse *)pColDef_local,pTStack_28,pTStack_28->zName);
            }
            else {
              sqlite3ErrorMsg((Parse *)pColDef_local,
                              "Cannot add a NOT NULL column with default value NULL");
            }
          }
          else {
            sqlite3ErrorMsg((Parse *)pColDef_local,
                            "Cannot add a REFERENCES column with non-NULL default value");
          }
        }
        else {
          sqlite3ErrorMsg((Parse *)pColDef_local,"Cannot add a UNIQUE column");
        }
      }
      else {
        sqlite3ErrorMsg((Parse *)pColDef_local,"Cannot add a PRIMARY KEY column");
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterFinishAddColumn(Parse *pParse, Token *pColDef){
  Table *pNew;              /* Copy of pParse->pNewTable */
  Table *pTab;              /* Table being altered */
  int iDb;                  /* Database number */
  const char *zDb;          /* Database name */
  const char *zTab;         /* Table name */
  char *zCol;               /* Null-terminated column definition */
  Column *pCol;             /* The new column */
  Expr *pDflt;              /* Default value for the new column */
  sqlite3 *db;              /* The database connection; */
  Vdbe *v = pParse->pVdbe;  /* The prepared statement under construction */
  int r1;                   /* Temporary registers */

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ) return;
  assert( v!=0 );
  pNew = pParse->pNewTable;
  assert( pNew );

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pNew->pSchema);
  zDb = db->aDb[iDb].zDbSName;
  zTab = &pNew->zName[16];  /* Skip the "sqlite_altertab_" prefix on the name */
  pCol = &pNew->aCol[pNew->nCol-1];
  pDflt = pCol->pDflt;
  pTab = sqlite3FindTable(db, zTab, zDb);
  assert( pTab );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    return;
  }
#endif

  /* If the default value for the new column was specified with a 
  ** literal NULL, then set pDflt to 0. This simplifies checking
  ** for an SQL NULL default below.
  */
  assert( pDflt==0 || pDflt->op==TK_SPAN );
  if( pDflt && pDflt->pLeft->op==TK_NULL ){
    pDflt = 0;
  }

  /* Check that the new column is not specified as PRIMARY KEY or UNIQUE.
  ** If there is a NOT NULL constraint, then the default value for the
  ** column must not be NULL.
  */
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    sqlite3ErrorMsg(pParse, "Cannot add a PRIMARY KEY column");
    return;
  }
  if( pNew->pIndex ){
    sqlite3ErrorMsg(pParse, "Cannot add a UNIQUE column");
    return;
  }
  if( (db->flags&SQLITE_ForeignKeys) && pNew->pFKey && pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a REFERENCES column with non-NULL default value");
    return;
  }
  if( pCol->notNull && !pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a NOT NULL column with default value NULL");
    return;
  }

  /* Ensure the default expression is something that sqlite3ValueFromExpr()
  ** can handle (i.e. not CURRENT_TIME etc.)
  */
  if( pDflt ){
    sqlite3_value *pVal = 0;
    int rc;
    rc = sqlite3ValueFromExpr(db, pDflt, SQLITE_UTF8, SQLITE_AFF_BLOB, &pVal);
    assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
    if( rc!=SQLITE_OK ){
      assert( db->mallocFailed == 1 );
      return;
    }
    if( !pVal ){
      sqlite3ErrorMsg(pParse, "Cannot add a column with non-constant default");
      return;
    }
    sqlite3ValueFree(pVal);
  }

  /* Modify the CREATE TABLE statement. */
  zCol = sqlite3DbStrNDup(db, (char*)pColDef->z, pColDef->n);
  if( zCol ){
    char *zEnd = &zCol[pColDef->n-1];
    int savedDbFlags = db->flags;
    while( zEnd>zCol && (*zEnd==';' || sqlite3Isspace(*zEnd)) ){
      *zEnd-- = '\0';
    }
    db->flags |= SQLITE_PreferBuiltin;
    sqlite3NestedParse(pParse, 
        "UPDATE \"%w\".%s SET "
          "sql = substr(sql,1,%d) || ', ' || %Q || substr(sql,%d) "
        "WHERE type = 'table' AND name = %Q", 
      zDb, MASTER_NAME, pNew->addColOffset, zCol, pNew->addColOffset+1,
      zTab
    );
    sqlite3DbFree(db, zCol);
    db->flags = savedDbFlags;
  }

  /* Make sure the schema version is at least 3.  But do not upgrade
  ** from less than 3 to 4, as that will corrupt any preexisting DESC
  ** index.
  */
  r1 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, r1, BTREE_FILE_FORMAT);
  sqlite3VdbeUsesBtree(v, iDb);
  sqlite3VdbeAddOp2(v, OP_AddImm, r1, -2);
  sqlite3VdbeAddOp2(v, OP_IfPos, r1, sqlite3VdbeCurrentAddr(v)+2);
  VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, 3);
  sqlite3ReleaseTempReg(pParse, r1);

  /* Reload the schema of the modified table. */
  reloadTableSchema(pParse, pTab, pTab->zName);
}